

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinomialQueue.hpp
# Opt level: O0

size_t __thiscall
guts::BinomialQueue<int>::remove_sub(BinomialQueue<int> *this,size_t index,size_t prev)

{
  size_t sVar1;
  reference pvVar2;
  ulong index_00;
  size_t local_50;
  size_t next;
  size_t child;
  size_t parent;
  size_t prev_local;
  size_t index_local;
  BinomialQueue<int> *this_local;
  
  pvVar2 = std::
           vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>::
           operator[](&this->mNodes,index);
  child = pvVar2->mRchild;
  while ((child & 0xffffffff80000000) == 0) {
    pvVar2 = std::
             vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ::operator[](&this->mNodes,child);
    child = pvVar2->mRchild;
  }
  parent = prev;
  if (child != 0xffffffffffffffff) {
    index_00 = child & 0x7fffffff;
    parent = remove_sub(this,index_00,prev);
    pvVar2 = std::
             vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ::operator[](&this->mNodes,index_00);
    next = pvVar2->mLchild;
    while (next != index) {
      pvVar2 = std::
               vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
               ::operator[](&this->mNodes,next);
      sVar1 = pvVar2->mRchild;
      pvVar2 = std::
               vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
               ::operator[](&this->mNodes,next);
      pvVar2->mRchild = parent;
      parent = next;
      next = sVar1;
    }
    pvVar2 = std::
             vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ::operator[](&this->mNodes,index);
    if ((pvVar2->mRchild & 0xffffffff80000000) == 0) {
      pvVar2 = std::
               vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
               ::operator[](&this->mNodes,index);
      local_50 = pvVar2->mRchild;
    }
    else {
      local_50 = 0xffffffffffffffff;
    }
    pvVar2 = std::
             vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ::operator[](&this->mNodes,index_00);
    pvVar2->mLchild = local_50;
    pvVar2 = std::
             vector<guts::BinomialQueue<int>::Node,_std::allocator<guts::BinomialQueue<int>::Node>_>
             ::operator[](&this->mNodes,index_00);
    pvVar2->mRchild = parent;
    parent = index_00;
  }
  return parent;
}

Assistant:

size_t BinomialQueue<Key>::remove_sub(size_t index, size_t prev)
    { 
        size_t parent = mNodes[index].mRchild;
        while ((parent & PARENT_REF) == 0)
        {
            parent = mNodes[parent].mRchild;
        } 
                
        if (parent != NO_REF)
        {
            parent &= ~PARENT_REF;

            prev = remove_sub(parent, prev);

            size_t child = mNodes[parent].mLchild;
            
            while (child != index)
            {
                size_t next = mNodes[child].mRchild;
                mNodes[child].mRchild = prev;
                prev = child;
                child = next;
            }
            
            mNodes[parent].mLchild = (mNodes[index].mRchild & PARENT_REF) == 0 ? mNodes[index].mRchild : NO_REF;
            mNodes[parent].mRchild = prev;
            prev = parent;
        }

        return prev;
    }